

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.cc
# Opt level: O3

size_t __thiscall
CoreML::Specification::ItemSimilarityRecommender::ByteSizeLong(ItemSimilarityRecommender *this)

{
  size_type sVar1;
  int iVar2;
  uint uVar3;
  Type *this_00;
  size_t sVar4;
  uint uVar5;
  ulong uVar6;
  uint index;
  
  uVar5 = (this->itemitemsimilarities_).super_RepeatedPtrFieldBase.current_size_;
  uVar6 = (ulong)uVar5;
  index = 0;
  if (uVar6 == 0) {
    uVar6 = 0;
  }
  else {
    do {
      this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<CoreML::Specification::ItemSimilarityRecommender_SimilarItems>::TypeHandler>
                          (&(this->itemitemsimilarities_).super_RepeatedPtrFieldBase,index);
      sVar4 = ItemSimilarityRecommender_SimilarItems::ByteSizeLong(this_00);
      uVar3 = (uint)sVar4 | 1;
      iVar2 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar6 = uVar6 + sVar4 + (ulong)(iVar2 * 9 + 0x49U >> 6);
      index = index + 1;
    } while (uVar5 != index);
  }
  sVar1 = ((this->iteminputfeaturename_).ptr_)->_M_string_length;
  if (sVar1 != 0) {
    uVar5 = (uint)sVar1 | 1;
    iVar2 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    uVar6 = uVar6 + sVar1 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
  }
  sVar1 = ((this->numrecommendationsinputfeaturename_).ptr_)->_M_string_length;
  if (sVar1 != 0) {
    uVar5 = (uint)sVar1 | 1;
    iVar2 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    uVar6 = uVar6 + sVar1 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
  }
  sVar1 = ((this->itemrestrictioninputfeaturename_).ptr_)->_M_string_length;
  if (sVar1 != 0) {
    uVar5 = (uint)sVar1 | 1;
    iVar2 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    uVar6 = uVar6 + sVar1 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
  }
  sVar1 = ((this->itemexclusioninputfeaturename_).ptr_)->_M_string_length;
  if (sVar1 != 0) {
    uVar5 = (uint)sVar1 | 1;
    iVar2 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    uVar6 = uVar6 + sVar1 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
  }
  sVar1 = ((this->recommendeditemlistoutputfeaturename_).ptr_)->_M_string_length;
  if (sVar1 != 0) {
    uVar5 = (uint)sVar1 | 1;
    iVar2 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    uVar6 = uVar6 + sVar1 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 2;
  }
  sVar1 = ((this->recommendeditemscoreoutputfeaturename_).ptr_)->_M_string_length;
  if (sVar1 != 0) {
    uVar5 = (uint)sVar1 | 1;
    iVar2 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    uVar6 = uVar6 + sVar1 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 2;
  }
  if (this->itemstringids_ != (StringVector *)0x0 &&
      this != (ItemSimilarityRecommender *)&_ItemSimilarityRecommender_default_instance_) {
    sVar4 = StringVector::ByteSizeLong(this->itemstringids_);
    uVar5 = (uint)sVar4 | 1;
    iVar2 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    uVar6 = uVar6 + sVar4 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
  }
  if (this->itemint64ids_ != (Int64Vector *)0x0 &&
      this != (ItemSimilarityRecommender *)&_ItemSimilarityRecommender_default_instance_) {
    sVar4 = Int64Vector::ByteSizeLong(this->itemint64ids_);
    uVar5 = (uint)sVar4 | 1;
    iVar2 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    uVar6 = uVar6 + sVar4 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
  }
  this->_cached_size_ = (int)uVar6;
  return uVar6;
}

Assistant:

size_t ItemSimilarityRecommender::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.ItemSimilarityRecommender)
  size_t total_size = 0;

  // repeated .CoreML.Specification.ItemSimilarityRecommender.SimilarItems itemItemSimilarities = 1;
  {
    unsigned int count = this->itemitemsimilarities_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->itemitemsimilarities(i));
    }
  }

  // string itemInputFeatureName = 10;
  if (this->iteminputfeaturename().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->iteminputfeaturename());
  }

  // string numRecommendationsInputFeatureName = 11;
  if (this->numrecommendationsinputfeaturename().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->numrecommendationsinputfeaturename());
  }

  // string itemRestrictionInputFeatureName = 12;
  if (this->itemrestrictioninputfeaturename().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->itemrestrictioninputfeaturename());
  }

  // string itemExclusionInputFeatureName = 13;
  if (this->itemexclusioninputfeaturename().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->itemexclusioninputfeaturename());
  }

  // string recommendedItemListOutputFeatureName = 20;
  if (this->recommendeditemlistoutputfeaturename().size() > 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->recommendeditemlistoutputfeaturename());
  }

  // string recommendedItemScoreOutputFeatureName = 21;
  if (this->recommendeditemscoreoutputfeaturename().size() > 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->recommendeditemscoreoutputfeaturename());
  }

  // .CoreML.Specification.StringVector itemStringIds = 2;
  if (this->has_itemstringids()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->itemstringids_);
  }

  // .CoreML.Specification.Int64Vector itemInt64Ids = 3;
  if (this->has_itemint64ids()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->itemint64ids_);
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}